

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cimgui.cpp
# Opt level: O2

void ImVector_ImFontGlyph_push_back(ImVector_ImFontGlyph *self,ImFontGlyph v)

{
  ImVector<ImFontGlyph>::push_back(self,&v);
  return;
}

Assistant:

CIMGUI_API void ImVector_ImFontGlyph_push_back(ImVector_ImFontGlyph* self,const ImFontGlyph v)
{
    return self->push_back(v);
}